

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StringEncode * __thiscall
wasm::Builder::makeStringEncode
          (Builder *this,StringEncodeOp op,Expression *str,Expression *array,Expression *start)

{
  StringEncode *this_00;
  
  this_00 = MixedArena::alloc<wasm::StringEncode>(&this->wasm->allocator);
  this_00->op = op;
  this_00->str = str;
  this_00->array = array;
  this_00->start = start;
  StringEncode::finalize(this_00);
  return this_00;
}

Assistant:

StringEncode* makeStringEncode(StringEncodeOp op,
                                 Expression* str,
                                 Expression* array,
                                 Expression* start = nullptr) {
    auto* ret = wasm.allocator.alloc<StringEncode>();
    ret->op = op;
    ret->str = str;
    ret->array = array;
    ret->start = start;
    ret->finalize();
    return ret;
  }